

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O0

HeapType __thiscall
wasm::UniqueDeferredQueue<wasm::HeapType>::pop(UniqueDeferredQueue<wasm::HeapType> *this)

{
  bool bVar1;
  reference pvVar2;
  mapped_type *pmVar3;
  UniqueDeferredQueue<wasm::HeapType> *this_local;
  HeapType item;
  
  do {
    bVar1 = empty(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/unique_deferring_queue.h"
                    ,0x34,"T wasm::UniqueDeferredQueue<wasm::HeapType>::pop() [T = wasm::HeapType]")
      ;
    }
    pvVar2 = std::
             queue<wasm::HeapType,_std::deque<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>::
             front(&this->data);
    this_local = (UniqueDeferredQueue<wasm::HeapType> *)pvVar2->id;
    pmVar3 = std::
             unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
             ::operator[](&this->count,(key_type *)&this_local);
    *pmVar3 = *pmVar3 - 1;
    std::queue<wasm::HeapType,_std::deque<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>::pop
              (&this->data);
    pmVar3 = std::
             unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
             ::operator[](&this->count,(key_type *)&this_local);
  } while (*pmVar3 != 0);
  return (HeapType)(uintptr_t)this_local;
}

Assistant:

T pop() {
    while (1) {
      assert(!empty());
      T item = data.front();
      count[item]--;
      data.pop();
      if (count[item] == 0) {
        return item;
      }
      // skip this one, keep going
    }
  }